

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O3

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Keyword(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
          *this,Static_String *t_s)

{
  byte *pbVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  Depth_Counter dc;
  Position start;
  Depth_Counter local_40;
  undefined8 local_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  Depth_Counter::Depth_Counter(&local_40,this);
  SkipWS(this,false);
  local_38._0_4_ = (this->m_position).line;
  local_38._4_4_ = (this->m_position).col;
  pcVar2 = (this->m_position).m_pos;
  pcVar3 = (this->m_position).m_end;
  uVar4 = *(undefined8 *)&(this->m_position).m_last_col;
  local_28 = SUB84(pcVar3,0);
  uStack_24 = (undefined4)((ulong)pcVar3 >> 0x20);
  uStack_20 = (undefined4)uVar4;
  uStack_1c = (undefined4)((ulong)uVar4 >> 0x20);
  uStack_30 = SUB84(pcVar2,0);
  uStack_2c = (undefined4)((ulong)pcVar2 >> 0x20);
  bVar5 = Keyword_(this,t_s);
  if (bVar5) {
    pbVar1 = (byte *)(this->m_position).m_pos;
    bVar5 = true;
    if ((pbVar1 == (byte *)(this->m_position).m_end) ||
       (m_alphabet._M_elems[1]._M_elems[*pbVar1] != true)) goto LAB_003246c4;
    *(ulong *)((long)&(this->m_position).m_pos + 4) = CONCAT44(local_28,uStack_2c);
    *(ulong *)((long)&(this->m_position).m_end + 4) = CONCAT44(uStack_20,uStack_24);
    (this->m_position).line = (undefined4)local_38;
    (this->m_position).col = local_38._4_4_;
    (this->m_position).m_pos = (char *)CONCAT44(uStack_2c,uStack_30);
  }
  bVar5 = false;
LAB_003246c4:
  (local_40.parser)->m_current_parse_depth = (local_40.parser)->m_current_parse_depth - 1;
  return bVar5;
}

Assistant:

bool Keyword(const utility::Static_String &t_s) {
        Depth_Counter dc{this};
        SkipWS();
        const auto start = m_position;
        bool retval = Keyword_(t_s);
        // ignore substring matches
        if (retval && m_position.has_more() && char_in_alphabet(*m_position, detail::keyword_alphabet)) {
          m_position = start;
          retval = false;
        }

        return retval;
      }